

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_sx_w16n_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint8_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  char cVar21;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  undefined1 auVar22 [16];
  char cVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  auVar19 = _DAT_00477230;
  auVar18 = _DAT_00476d70;
  do {
    for (lVar20 = 0; lVar20 < w; lVar20 = lVar20 + 0x10) {
      auVar22 = pshufb(*(undefined1 (*) [16])(mask + lVar20 * 2),auVar19);
      auVar38 = pshufb(*(undefined1 (*) [16])(mask + lVar20 * 2 + 0x10),auVar19);
      cVar21 = pavgb(auVar22[8],auVar22[0]);
      cVar23 = pavgb(auVar22[9],auVar22[1]);
      cVar24 = pavgb(auVar22[10],auVar22[2]);
      cVar25 = pavgb(auVar22[0xb],auVar22[3]);
      cVar26 = pavgb(auVar22[0xc],auVar22[4]);
      cVar27 = pavgb(auVar22[0xd],auVar22[5]);
      cVar28 = pavgb(auVar22[0xe],auVar22[6]);
      cVar29 = pavgb(auVar22[0xf],auVar22[7]);
      cVar30 = pavgb(auVar38[8],auVar38[0]);
      cVar31 = pavgb(auVar38[9],auVar38[1]);
      cVar32 = pavgb(auVar38[10],auVar38[2]);
      cVar33 = pavgb(auVar38[0xb],auVar38[3]);
      cVar34 = pavgb(auVar38[0xc],auVar38[4]);
      cVar35 = pavgb(auVar38[0xd],auVar38[5]);
      cVar36 = pavgb(auVar38[0xe],auVar38[6]);
      cVar37 = pavgb(auVar38[0xf],auVar38[7]);
      auVar22 = *(undefined1 (*) [16])(src0 + lVar20);
      puVar1 = src1 + lVar20;
      auVar45._0_14_ = auVar22._0_14_;
      auVar45[0xe] = auVar22[7];
      auVar45[0xf] = puVar1[7];
      auVar44._14_2_ = auVar45._14_2_;
      auVar44._0_13_ = auVar22._0_13_;
      auVar44[0xd] = puVar1[6];
      auVar43._13_3_ = auVar44._13_3_;
      auVar43._0_12_ = auVar22._0_12_;
      auVar43[0xc] = auVar22[6];
      auVar42._12_4_ = auVar43._12_4_;
      auVar42._0_11_ = auVar22._0_11_;
      auVar42[0xb] = puVar1[5];
      auVar41._11_5_ = auVar42._11_5_;
      auVar41._0_10_ = auVar22._0_10_;
      auVar41[10] = auVar22[5];
      auVar40._10_6_ = auVar41._10_6_;
      auVar40._0_9_ = auVar22._0_9_;
      auVar40[9] = puVar1[4];
      auVar39._9_7_ = auVar40._9_7_;
      auVar39._0_8_ = auVar22._0_8_;
      auVar39[8] = auVar22[4];
      auVar46._8_8_ = auVar39._8_8_;
      auVar46[7] = puVar1[3];
      auVar46[6] = auVar22[3];
      auVar46[5] = puVar1[2];
      auVar46[4] = auVar22[2];
      auVar46[3] = puVar1[1];
      auVar46[2] = auVar22[1];
      auVar46[0] = auVar22[0];
      auVar46[1] = *puVar1;
      auVar47._8_8_ =
           (undefined8)
           (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11('@' - cVar29,cVar29),
                                                                  '@' - cVar28),cVar28),'@' - cVar27
                                               ),cVar27),'@' - cVar26),CONCAT11(cVar26,cVar29)) >> 8
           );
      auVar47[7] = '@' - cVar25;
      auVar47[6] = cVar25;
      auVar47[5] = '@' - cVar24;
      auVar47[4] = cVar24;
      auVar47[3] = '@' - cVar23;
      auVar47[2] = cVar23;
      auVar47[1] = '@' - cVar21;
      auVar47[0] = cVar21;
      auVar46 = pmaddubsw(auVar46,auVar47);
      auVar38[1] = puVar1[8];
      auVar38[0] = auVar22[8];
      auVar38[2] = auVar22[9];
      auVar38[3] = puVar1[9];
      auVar38[4] = auVar22[10];
      auVar38[5] = puVar1[10];
      auVar38[6] = auVar22[0xb];
      auVar38[7] = puVar1[0xb];
      auVar38[8] = auVar22[0xc];
      auVar38[9] = puVar1[0xc];
      auVar38[10] = auVar22[0xd];
      auVar38[0xb] = puVar1[0xd];
      auVar38[0xc] = auVar22[0xe];
      auVar38[0xd] = puVar1[0xe];
      auVar38[0xe] = auVar22[0xf];
      auVar38[0xf] = puVar1[0xf];
      auVar22[1] = '@' - cVar30;
      auVar22[0] = cVar30;
      auVar22[2] = cVar31;
      auVar22[3] = '@' - cVar31;
      auVar22[4] = cVar32;
      auVar22[5] = '@' - cVar32;
      auVar22[6] = cVar33;
      auVar22[7] = '@' - cVar33;
      auVar22[8] = cVar34;
      auVar22[9] = '@' - cVar34;
      auVar22[10] = cVar35;
      auVar22[0xb] = '@' - cVar35;
      auVar22[0xc] = cVar36;
      auVar22[0xd] = '@' - cVar36;
      auVar22[0xe] = cVar37;
      auVar22[0xf] = '@' - cVar37;
      auVar22 = pmaddubsw(auVar38,auVar22);
      auVar38 = pmulhrsw(auVar46,auVar18);
      auVar22 = pmulhrsw(auVar22,auVar18);
      sVar2 = auVar38._0_2_;
      sVar3 = auVar38._2_2_;
      sVar4 = auVar38._4_2_;
      sVar5 = auVar38._6_2_;
      sVar6 = auVar38._8_2_;
      sVar7 = auVar38._10_2_;
      sVar8 = auVar38._12_2_;
      sVar9 = auVar38._14_2_;
      sVar10 = auVar22._0_2_;
      sVar11 = auVar22._2_2_;
      sVar12 = auVar22._4_2_;
      sVar13 = auVar22._6_2_;
      sVar14 = auVar22._8_2_;
      sVar15 = auVar22._10_2_;
      sVar16 = auVar22._12_2_;
      sVar17 = auVar22._14_2_;
      puVar1 = dst + lVar20;
      *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar38[0] - (0xff < sVar2);
      puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar38[2] - (0xff < sVar3);
      puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar38[4] - (0xff < sVar4);
      puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar38[6] - (0xff < sVar5);
      puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar38[8] - (0xff < sVar6);
      puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar38[10] - (0xff < sVar7);
      puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar38[0xc] - (0xff < sVar8);
      puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar38[0xe] - (0xff < sVar9);
      puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar22[0] - (0xff < sVar10);
      puVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar22[2] - (0xff < sVar11);
      puVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar22[4] - (0xff < sVar12);
      puVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar22[6] - (0xff < sVar13);
      puVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar22[8] - (0xff < sVar14);
      puVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar22[10] - (0xff < sVar15);
      puVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar22[0xc] - (0xff < sVar16);
      puVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar22[0xe] - (0xff < sVar17);
    }
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    mask = mask + mask_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_w16n_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));

  do {
    int c;
    for (c = 0; c < w; c += 16) {
      const __m128i v_r0_b = xx_loadu_128(mask + 2 * c);
      const __m128i v_r1_b = xx_loadu_128(mask + 2 * c + 16);
      const __m128i v_r0_s_b = _mm_shuffle_epi8(v_r0_b, v_shuffle_b);
      const __m128i v_r1_s_b = _mm_shuffle_epi8(v_r1_b, v_shuffle_b);
      const __m128i v_r_lo_b = _mm_unpacklo_epi64(v_r0_s_b, v_r1_s_b);
      const __m128i v_r_hi_b = _mm_unpackhi_epi64(v_r0_s_b, v_r1_s_b);
      const __m128i v_m0_b = _mm_avg_epu8(v_r_lo_b, v_r_hi_b);
      const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

      const __m128i v_res_b =
          blend_16_u8(src0 + c, src1 + c, &v_m0_b, &v_m1_b, &_r);

      xx_storeu_128(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}